

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsClient.cpp
# Opt level: O2

void xs::sendMessage(Socket *socket,Message *message)

{
  ssize_t sVar1;
  SocketError *this;
  void *__buf;
  undefined8 in_R8;
  ulong uVar2;
  size_t numSent;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  
  buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*message->_vptr_Message[2])(message);
  uVar2 = 0;
  while( true ) {
    __buf = (void *)(((long)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_start) - uVar2);
    if ((ulong)((long)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start) < uVar2 || __buf == (void *)0x0) {
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      return;
    }
    numSent = 0;
    sVar1 = de::Socket::send(socket,(int)buf.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start + (int)uVar2,
                             __buf,(size_t)&numSent,(int)in_R8);
    if ((deSocketResult)sVar1 != DE_SOCKETRESULT_SUCCESS) break;
    uVar2 = uVar2 + numSent;
  }
  this = (SocketError *)__cxa_allocate_exception(0x18);
  SocketError::SocketError
            (this,(deSocketResult)sVar1,"send() failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/execserver/tools/xsClient.cpp"
             ,0x4e);
  __cxa_throw(this,&SocketError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void sendMessage (de::Socket& socket, const Message& message)
{
	// Format message.
	vector<deUint8> buf;
	message.write(buf);

	// Write to socket.
	size_t pos = 0;
	while (pos < buf.size())
	{
		size_t			numLeft		= buf.size() - pos;
		size_t			numSent		= 0;
		deSocketResult	result		= socket.send(&buf[pos], numLeft, &numSent);

		if (result != DE_SOCKETRESULT_SUCCESS)
			throw SocketError(result, "send() failed", __FILE__, __LINE__);

		pos += numSent;
	}
}